

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O1

int rtr_check_interval_option
              (rtr_socket *rtr_socket,int interval_mode,uint32_t interval,rtr_interval_type type)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (type == RTR_INTERVAL_TYPE_RETRY) {
    bVar6 = interval == 0;
    uVar2 = 1;
    uVar5 = 0x1c20;
  }
  else if (type == RTR_INTERVAL_TYPE_REFRESH) {
    bVar6 = interval == 0;
    uVar2 = 1;
    uVar5 = 0x15180;
  }
  else {
    if (type != RTR_INTERVAL_TYPE_EXPIRATION) {
      lrtr_dbg("RTR Socket: Invalid interval type: %u.",(ulong)type);
      iVar4 = -1;
      goto LAB_0010891f;
    }
    bVar6 = interval < 600;
    uVar2 = 600;
    uVar5 = 0x2a300;
  }
  if ((interval_mode == 1) || ((bool)(interval <= uVar5 & (bVar6 ^ 1U)))) {
    iVar4 = 0;
    if (type == RTR_INTERVAL_TYPE_RETRY) {
      rtr_socket->retry_interval = interval;
    }
    else if (type == RTR_INTERVAL_TYPE_REFRESH) {
      rtr_socket->refresh_interval = interval;
    }
    else if (type == RTR_INTERVAL_TYPE_EXPIRATION) {
      rtr_socket->expire_interval = interval;
    }
  }
  else if (interval_mode == 2) {
    iVar3 = 0;
    iVar4 = iVar3;
    if (bVar6) {
      if (type == RTR_INTERVAL_TYPE_RETRY) {
        rtr_socket->retry_interval = uVar2;
      }
      else if (type == RTR_INTERVAL_TYPE_REFRESH) {
        rtr_socket->refresh_interval = uVar2;
      }
      else {
        iVar4 = 0;
        if (type == RTR_INTERVAL_TYPE_EXPIRATION) {
          rtr_socket->expire_interval = uVar2;
          iVar4 = iVar3;
        }
      }
    }
    else if (type == RTR_INTERVAL_TYPE_RETRY) {
      rtr_socket->retry_interval = uVar5;
    }
    else if (type == RTR_INTERVAL_TYPE_REFRESH) {
      rtr_socket->refresh_interval = uVar5;
    }
    else if (type == RTR_INTERVAL_TYPE_EXPIRATION) {
      rtr_socket->expire_interval = uVar5;
    }
  }
  else {
    iVar4 = 0;
    lrtr_dbg("RTR Socket: Received expiration value out of range. Was %u. It will be ignored.",
             (ulong)interval);
  }
LAB_0010891f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int rtr_check_interval_option(struct rtr_socket *rtr_socket, int interval_mode, uint32_t interval,
			      enum rtr_interval_type type)
{
	uint16_t minimum;
	uint32_t maximum;

	int interv_retval;

	switch (type) {
	case RTR_INTERVAL_TYPE_EXPIRATION:
		minimum = RTR_EXPIRATION_MIN;
		maximum = RTR_EXPIRATION_MAX;
		interv_retval = rtr_check_interval_range(interval, minimum, maximum);
		break;
	case RTR_INTERVAL_TYPE_REFRESH:
		minimum = RTR_REFRESH_MIN;
		maximum = RTR_REFRESH_MAX;
		interv_retval = rtr_check_interval_range(interval, minimum, maximum);
		break;
	case RTR_INTERVAL_TYPE_RETRY:
		minimum = RTR_RETRY_MIN;
		maximum = RTR_RETRY_MAX;
		interv_retval = rtr_check_interval_range(interval, minimum, maximum);
		break;
	default:
		RTR_DBG("Invalid interval type: %u.", type);
		return RTR_ERROR;
	}

	if (interv_retval == RTR_INSIDE_INTERVAL_RANGE || interval_mode == RTR_INTERVAL_MODE_ACCEPT_ANY) {
		apply_interval_value(rtr_socket, interval, type);
	} else if (interval_mode == RTR_INTERVAL_MODE_DEFAULT_MIN_MAX) {
		if (interv_retval == RTR_BELOW_INTERVAL_RANGE)
			apply_interval_value(rtr_socket, minimum, type);
		else
			apply_interval_value(rtr_socket, maximum, type);
	} else {
		RTR_DBG("Received expiration value out of range. Was %u. It will be ignored.", interval);
	}

	return RTR_SUCCESS;
}